

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

void ncnn::copy_make_border_image<unsigned_short>
               (Mat *src,Mat *dst,int top,int left,int type,unsigned_short v)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  unsigned_short in_R9W;
  int x_8;
  int x_7;
  int x_6;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  int y_1;
  int x_2;
  int x_1;
  int x;
  int y;
  unsigned_short *outptr;
  unsigned_short *ptr;
  int h;
  int w;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  unsigned_short *local_38;
  unsigned_short *local_30;
  
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_30 = Mat::operator_cast_to_unsigned_short_(in_RDI);
  local_38 = Mat::operator_cast_to_unsigned_short_(in_RSI);
  if (in_R8D == 0) {
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
        local_38[local_40] = in_R9W;
      }
      local_38 = local_38 + iVar1;
    }
    for (; local_3c < in_EDX + in_RDI->h; local_3c = local_3c + 1) {
      for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
        local_38[local_44] = in_R9W;
      }
      if (in_RDI->w < 0xc) {
        for (; local_44 < in_ECX + in_RDI->w; local_44 = local_44 + 1) {
          local_38[local_44] = local_30[local_44 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_44 = in_RDI->w + local_44;
      }
      for (; local_44 < iVar1; local_44 = local_44 + 1) {
        local_38[local_44] = in_R9W;
      }
      local_30 = local_30 + in_RDI->w;
      local_38 = local_38 + iVar1;
    }
    for (; local_3c < iVar2; local_3c = local_3c + 1) {
      for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
        local_38[local_48] = in_R9W;
      }
      local_38 = local_38 + iVar1;
    }
  }
  if (in_R8D == 1) {
    for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
        local_38[local_50] = *local_30;
      }
      if (in_RDI->w < 0xc) {
        for (; local_50 < in_ECX + in_RDI->w; local_50 = local_50 + 1) {
          local_38[local_50] = local_30[local_50 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_50 = in_RDI->w + local_50;
      }
      for (; local_50 < iVar1; local_50 = local_50 + 1) {
        local_38[local_50] = local_30[in_RDI->w + -1];
      }
      local_38 = local_38 + iVar1;
    }
    for (; local_4c < in_EDX + in_RDI->h; local_4c = local_4c + 1) {
      for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
        local_38[local_54] = *local_30;
      }
      if (in_RDI->w < 0xc) {
        for (; local_54 < in_ECX + in_RDI->w; local_54 = local_54 + 1) {
          local_38[local_54] = local_30[local_54 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_54 = in_RDI->w + local_54;
      }
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        local_38[local_54] = local_30[in_RDI->w + -1];
      }
      local_30 = local_30 + in_RDI->w;
      local_38 = local_38 + iVar1;
    }
    local_30 = local_30 + -(long)in_RDI->w;
    for (; local_4c < iVar2; local_4c = local_4c + 1) {
      for (local_58 = 0; local_58 < in_ECX; local_58 = local_58 + 1) {
        local_38[local_58] = *local_30;
      }
      if (in_RDI->w < 0xc) {
        for (; local_58 < in_ECX + in_RDI->w; local_58 = local_58 + 1) {
          local_38[local_58] = local_30[local_58 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_58 = in_RDI->w + local_58;
      }
      for (; local_58 < iVar1; local_58 = local_58 + 1) {
        local_38[local_58] = local_30[in_RDI->w + -1];
      }
      local_38 = local_38 + iVar1;
    }
  }
  if (in_R8D == 2) {
    local_5c = 0;
    local_30 = local_30 + in_EDX * in_RDI->w;
    for (; local_5c < in_EDX; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < in_ECX; local_60 = local_60 + 1) {
        local_38[local_60] = local_30[in_ECX - local_60];
      }
      if (in_RDI->w < 0xc) {
        for (; local_60 < in_ECX + in_RDI->w; local_60 = local_60 + 1) {
          local_38[local_60] = local_30[local_60 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_60 = in_RDI->w + local_60;
      }
      for (; local_60 < iVar1; local_60 = local_60 + 1) {
        local_38[local_60] = local_30[(in_RDI->w - ((local_60 - in_ECX) - in_RDI->w)) + -2];
      }
      local_38 = local_38 + iVar1;
      local_30 = local_30 + -(long)in_RDI->w;
    }
    for (; local_5c < in_EDX + in_RDI->h; local_5c = local_5c + 1) {
      for (local_64 = 0; local_64 < in_ECX; local_64 = local_64 + 1) {
        local_38[local_64] = local_30[in_ECX - local_64];
      }
      if (in_RDI->w < 0xc) {
        for (; local_64 < in_ECX + in_RDI->w; local_64 = local_64 + 1) {
          local_38[local_64] = local_30[local_64 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_64 = in_RDI->w + local_64;
      }
      for (; local_64 < iVar1; local_64 = local_64 + 1) {
        local_38[local_64] = local_30[(in_RDI->w - ((local_64 - in_ECX) - in_RDI->w)) + -2];
      }
      local_30 = local_30 + in_RDI->w;
      local_38 = local_38 + iVar1;
    }
    local_30 = local_30 + -(long)(in_RDI->w << 1);
    for (; local_5c < iVar2; local_5c = local_5c + 1) {
      for (local_68 = 0; local_68 < in_ECX; local_68 = local_68 + 1) {
        local_38[local_68] = local_30[in_ECX - local_68];
      }
      if (in_RDI->w < 0xc) {
        for (; local_68 < in_ECX + in_RDI->w; local_68 = local_68 + 1) {
          local_38[local_68] = local_30[local_68 - in_ECX];
        }
      }
      else {
        memcpy(local_38 + in_ECX,local_30,(long)in_RDI->w << 1);
        local_68 = in_RDI->w + local_68;
      }
      for (; local_68 < iVar1; local_68 = local_68 + 1) {
        local_38[local_68] = local_30[(in_RDI->w - ((local_68 - in_ECX) - in_RDI->w)) + -2];
      }
      local_38 = local_38 + iVar1;
      local_30 = local_30 + -(long)in_RDI->w;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}